

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O0

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::PointSpeedParentToLocal
          (ChVector<double> *__return_storage_ptr__,ChFrameMoving<double> *this,
          ChVector<double> *parentpos,ChVector<double> *parentspeed)

{
  ChQuaternion<double> local_128;
  ChQuaternion<double> local_108;
  ChQuaternion<double> local_e8;
  ChQuaternion<double> local_c8;
  ChVector<double> local_a8;
  ChVector<double> local_90;
  ChVector<double> local_78;
  ChVector<double> local_60;
  Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_48;
  undefined1 local_40 [8];
  ChVector<double> localpos;
  ChVector<double> *parentspeed_local;
  ChVector<double> *parentpos_local;
  ChFrameMoving<double> *this_local;
  
  localpos.m_data[2] = (double)parentspeed;
  ChFrame<double>::TransformParentToLocal
            ((ChVector<double> *)local_40,&this->super_ChFrame<double>,parentpos);
  local_48.m_matrix =
       (non_const_type)
       Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::transpose
                 ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                  &(this->super_ChFrame<double>).Amatrix);
  ChVector<double>::operator-
            (&local_78,(ChVector<double> *)localpos.m_data[2],&(this->coord_dt).pos);
  ChQuaternion<double>::ChQuaternion(&local_108,0.0,(ChVector<double> *)local_40);
  ChQuaternion<double>::operator%(&local_e8,&(this->coord_dt).rot,&local_108);
  ChQuaternion<double>::GetConjugate(&local_128,&(this->super_ChFrame<double>).coord.rot);
  ChQuaternion<double>::operator%(&local_c8,&local_e8,&local_128);
  ChQuaternion<double>::GetVector(&local_a8,&local_c8);
  ChVector<double>::operator*(&local_90,&local_a8,2.0);
  ChVector<double>::operator-(&local_60,&local_78,&local_90);
  operator*(__return_storage_ptr__,&local_48,&local_60);
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> PointSpeedParentToLocal(const ChVector<Real>& parentpos, const ChVector<Real>& parentspeed) const {
        ChVector<Real> localpos = ChFrame<Real>::TransformParentToLocal(parentpos);
        return this->Amatrix.transpose() *
               (parentspeed - coord_dt.pos -
                ((coord_dt.rot % ChQuaternion<Real>(0, localpos) % this->coord.rot.GetConjugate()).GetVector() * 2));
    }